

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

int __thiscall
QItemSelectionModel::select
          (QItemSelectionModel *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  long lVar1;
  QFlags<QItemSelectionModel::SelectionFlag> lhs;
  bool bVar2;
  QItemSelectionModelPrivate *pQVar3;
  parameter_type pQVar4;
  long in_FS_OFFSET;
  SelectionFlags in_stack_0000002c;
  QItemSelectionModelPrivate *d;
  QItemSelection newSelection;
  QItemSelection old;
  QItemSelection sel;
  undefined4 in_stack_fffffffffffffec8;
  SelectionFlag in_stack_fffffffffffffecc;
  QItemSelectionModelPrivate *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffedc;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  bool bVar5;
  QMessageLogger *in_stack_fffffffffffffee0;
  QItemSelection local_d8;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_b8;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_b4;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_b0;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_ac;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_a8;
  Int local_a4;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_84;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_80;
  Int local_7c;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QItemSelection *other;
  QItemSelectionModelPrivate *this_00;
  QItemSelection *newSelection_00;
  QItemSelectionModel *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QItemSelectionModel *)0x82beac);
  pQVar4 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
           ::value((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                    *)in_stack_fffffffffffffed0);
  if (pQVar4 == (parameter_type)0x0) {
    QMessageLogger::QMessageLogger
              (in_stack_fffffffffffffee0,
               (char *)CONCAT17(in_stack_fffffffffffffedf,
                                CONCAT16(in_stack_fffffffffffffede,
                                         CONCAT24(in_stack_fffffffffffffedc,
                                                  in_stack_fffffffffffffed8))),
               (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffd0,
               "QItemSelectionModel: Selecting when no model has been set will result in a no-op.");
  }
  else {
    lhs.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
    super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i._2_1_ = in_stack_fffffffffffffede;
    lhs.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
    super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i._0_2_ = in_stack_fffffffffffffedc;
    lhs.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
    super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i._3_1_ = in_stack_fffffffffffffedf;
    bVar2 = ::operator==(lhs,(SelectionFlag)in_stack_fffffffffffffed0);
    if (!bVar2) {
      other = (QItemSelection *)&DAT_aaaaaaaaaaaaaaaa;
      this_00 = (QItemSelectionModelPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      newSelection_00 = (QItemSelection *)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelection::QItemSelection
                ((QItemSelection *)in_stack_fffffffffffffed0,
                 (QItemSelection *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      QList<QItemSelectionRange>::removeIf<(anonymous_namespace)::QtFunctionObjects::IsNotValid>
                (&(pQVar3->ranges).super_QList<QItemSelectionRange>);
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      QItemSelection::QItemSelection
                ((QItemSelection *)in_stack_fffffffffffffed0,
                 (QItemSelection *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      local_7c = (pQVar3->currentCommand).
                 super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i;
      QItemSelection::merge((QItemSelection *)this_00,other,in_stack_0000002c);
      local_80.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
           (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
           QFlags<QItemSelectionModel::SelectionFlag>::operator&
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_80);
      bVar5 = true;
      if (!bVar2) {
        local_84.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             QFlags<QItemSelectionModel::SelectionFlag>::operator&
                       ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffed0,
                        in_stack_fffffffffffffecc);
        bVar5 = ::QFlags::operator_cast_to_bool((QFlags *)&local_84);
      }
      if (bVar5 != false) {
        local_a4 = (Int)__readfds;
        QItemSelectionModelPrivate::expandSelection
                  (this_00,other,old.super_QList<QItemSelectionRange>.d.ptr._4_4_);
        QItemSelection::operator=
                  ((QItemSelection *)in_stack_fffffffffffffed0,
                   (QItemSelection *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        QItemSelection::~QItemSelection((QItemSelection *)0x82c088);
      }
      local_a8.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
           (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
           QFlags<QItemSelectionModel::SelectionFlag>::operator&
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_a8);
      if (bVar2) {
        QList<QItemSelectionRange>::clear((QList<QItemSelectionRange> *)in_stack_fffffffffffffed0);
        QList<QItemSelectionRange>::clear((QList<QItemSelectionRange> *)in_stack_fffffffffffffed0);
      }
      local_ac.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
           (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
           QFlags<QItemSelectionModel::SelectionFlag>::operator&
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_ac);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        QItemSelectionModelPrivate::finalize(in_stack_fffffffffffffed0);
      }
      local_b0.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
           (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
           QFlags<QItemSelectionModel::SelectionFlag>::operator&
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffed0,
                      in_stack_fffffffffffffecc);
      bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_b0);
      bVar5 = true;
      if (!bVar2) {
        local_b4.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
             (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
             QFlags<QItemSelectionModel::SelectionFlag>::operator&
                       ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffed0,
                        in_stack_fffffffffffffecc);
        bVar2 = ::QFlags::operator_cast_to_bool((QFlags *)&local_b4);
        bVar5 = true;
        if (!bVar2) {
          local_b8.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
               (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
               QFlags<QItemSelectionModel::SelectionFlag>::operator&
                         ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_fffffffffffffed0,
                          in_stack_fffffffffffffecc);
          bVar5 = ::QFlags::operator_cast_to_bool((QFlags *)&local_b8);
        }
      }
      if (bVar5 != false) {
        (pQVar3->currentCommand).super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
        super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i = (Int)__readfds;
        QItemSelection::operator=
                  ((QItemSelection *)in_stack_fffffffffffffed0,
                   (QItemSelection *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      }
      local_d8.super_QList<QItemSelectionRange>.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa
      ;
      local_d8.super_QList<QItemSelectionRange>.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QItemSelection::QItemSelection
                (&local_d8,
                 (QItemSelection *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      QItemSelection::merge((QItemSelection *)this_00,other,in_stack_0000002c);
      emitSelectionChanged(in_stack_ffffffffffffffc0,newSelection_00,(QItemSelection *)this_00);
      QItemSelection::~QItemSelection((QItemSelection *)0x82c289);
      QItemSelection::~QItemSelection((QItemSelection *)0x82c296);
      QItemSelection::~QItemSelection((QItemSelection *)0x82c2a3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)*(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void QItemSelectionModel::select(const QItemSelection &selection, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QItemSelectionModel);
    if (!d->model.value()) {
        qWarning("QItemSelectionModel: Selecting when no model has been set will result in a no-op.");
        return;
    }
    if (command == NoUpdate)
        return;

    // store old selection
    QItemSelection sel = selection;
    // If d->ranges is non-empty when the source model is reset the persistent indexes
    // it contains will be invalid. We can't clear them in a modelReset slot because that might already
    // be too late if another model observer is connected to the same modelReset slot and is invoked first
    // it might call select() on this selection model before any such QItemSelectionModelPrivate::modelReset() slot
    // is invoked, so it would not be cleared yet. We clear it invalid ranges in it here.
    d->ranges.removeIf(QtFunctionObjects::IsNotValid());

    QItemSelection old = d->ranges;
    old.merge(d->currentSelection, d->currentCommand);

    // expand selection according to SelectionBehavior
    if (command & Rows || command & Columns)
        sel = d->expandSelection(sel, command);

    // clear ranges and currentSelection
    if (command & Clear) {
        d->ranges.clear();
        d->currentSelection.clear();
    }

    // merge and clear currentSelection if Current was not set (ie. start new currentSelection)
    if (!(command & Current))
        d->finalize();

    // update currentSelection
    if (command & Toggle || command & Select || command & Deselect) {
        d->currentCommand = command;
        d->currentSelection = sel;
    }

    // generate new selection, compare with old and emit selectionChanged()
    QItemSelection newSelection = d->ranges;
    newSelection.merge(d->currentSelection, d->currentCommand);
    emitSelectionChanged(newSelection, old);
}